

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_MMDP_OnlineSolve.cpp
# Opt level: O1

double runSimulations(PlanningUnitDecPOMDPDiscrete *pu,SimulationDecPOMDPDiscrete *sim)

{
  long *plVar1;
  ulong uVar2;
  AgentQLearner *pAVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uVar7;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> agents;
  row_t row;
  QTable q;
  SimulationResult result;
  AgentQLearner agent;
  long *local_158;
  undefined8 uStack_150;
  long local_148;
  undefined1 *local_138;
  undefined8 local_130;
  QTable local_128 [8];
  undefined1 local_120 [24];
  long local_108;
  void *local_100;
  AgentQLearner *local_f8 [6];
  AgentQLearner local_c8 [152];
  
  plVar1 = *(long **)(pu + 0x330);
  uVar7 = (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0xb0)) + 0x70))
                    ((long)plVar1 + *(long *)(*plVar1 + -0xb0));
  uVar5 = 0;
  AgentQLearner::AgentQLearner
            ((AgentQLearner *)0x0,0x3fb999999999999a,0x3feccccccccccccd,uVar7,0x3fd999999999999a,
             local_c8,pu,0,2);
  local_158 = (long *)0x0;
  uStack_150 = 0;
  local_148 = 0;
  while( true ) {
    uVar2 = (**(code **)(*(long *)pu + 0x30))(pu);
    if (uVar2 <= uVar5) break;
    pAVar3 = (AgentQLearner *)operator_new(0x98);
    AgentQLearner::AgentQLearner(pAVar3,local_c8);
    (**(code **)(*(long *)(pAVar3 + *(long *)(*(long *)pAVar3 + -0x18)) + 0x18))
              (pAVar3 + *(long *)(*(long *)pAVar3 + -0x18),uVar5);
    local_f8[0] = pAVar3;
    std::vector<AgentFullyObservable*,std::allocator<AgentFullyObservable*>>::
    emplace_back<AgentFullyObservable*>
              ((vector<AgentFullyObservable*,std::allocator<AgentFullyObservable*>> *)&local_158,
               (AgentFullyObservable **)local_f8);
    *(long *)(pAVar3 + 0x78) = *local_158;
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
            ((SimulationDecPOMDPDiscrete *)local_f8,
             (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)sim);
  QTable::QTable(local_128,(QTable *)(*local_158 + 8));
  local_138 = local_120;
  local_130 = 0;
  *(undefined8 *)(NullPlanner::NullPlanner + *(long *)(std::cout + -0x18)) = 7;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Here\'s first row (state 0) from Q-learning result: \n",0x34);
  pbVar4 = boost::numeric::ublas::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                      (vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                       *)&local_138);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar4 + -0x18) + (char)pbVar4);
  std::ostream::put((char)pbVar4);
  std::ostream::flush();
  pAVar3 = local_f8[0];
  uVar6 = 0;
  while( true ) {
    uVar5 = (**(code **)(*(long *)pu + 0x30))(pu);
    if (uVar5 <= uVar6) break;
    if ((long *)local_158[uVar6] != (long *)0x0) {
      (**(code **)(*(long *)local_158[uVar6] + 8))();
    }
    uVar6 = uVar6 + 1;
  }
  if (local_108 != 0) {
    operator_delete(local_100,local_108 << 3);
  }
  SimulationResult::~SimulationResult((SimulationResult *)local_f8);
  if (local_158 != (long *)0x0) {
    operator_delete(local_158,local_148 - (long)local_158);
  }
  AgentQLearner::~AgentQLearner(local_c8);
  return (double)pAVar3;
}

Assistant:

double runSimulations(const PlanningUnitDecPOMDPDiscrete *pu,
                      const SimulationDecPOMDPDiscrete &sim)
{
    // create 'template' agent from which others are created
    AgentQLearner agent(pu, 0, 0.0, 0.1, 0.9, pu->GetDiscount());

    AgentQLearner *newAgent;
    vector<AgentFullyObservable*> agents;

    for(Index i=0; i < pu->GetNrAgents(); i++)
    {
        newAgent=new AgentQLearner(agent);
        newAgent->SetIndex(i);
        agents.push_back(newAgent);
        
        // Only one agent, id 0, is learning the joint policy in this example.
        // Others merely look up their action component from that joint learner.
        newAgent->SetFirstAgent(static_cast<AgentQLearner*>(agents[0]));
    }
    SimulationResult result = sim.RunSimulations(agents);

    QTable q = static_cast<AgentQLearner*>(agents[0])->GetQTable();
    row_t row   = q.GetRow(0);
    cout << setprecision(7)
         << "Here's first row (state 0) from Q-learning result: \n" << row << endl;

    double avgReward = result.GetAvgReward();
    for(Index i=0; i < pu->GetNrAgents(); i++)
        delete agents[i];

    return avgReward;
}